

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O2

osfildef * CCharmap::open_map_file(CResLoader *res_loader,char *table_name,charmap_type_t *map_type)

{
  FILE *__stream;
  long __off;
  size_t sVar1;
  ulong uVar2;
  charmap_type_t cVar3;
  uint uVar4;
  bool bVar5;
  ulong uVar6;
  bool bVar7;
  uchar buf [256];
  char respath [100];
  
  t3sprintf(respath,100,"charmap/%s.tcm",table_name);
  t3strlwr(respath);
  __stream = (FILE *)CResLoader::open_res_file(res_loader,respath,"charmap/cmaplib","CLIB");
  if (__stream != (FILE *)0x0) {
    __off = ftell(__stream);
    sVar1 = fread(buf,6,1,__stream);
    if (sVar1 == 1) {
      uVar4 = (uint)(ushort)buf._4_2_;
      bVar5 = false;
      bVar7 = false;
      do {
        if (uVar4 == 0) goto LAB_001f1002;
        uVar6 = 0x40;
        if (uVar4 < 0x40) {
          uVar6 = (ulong)uVar4;
        }
        sVar1 = fread(buf,(ulong)(uint)((int)uVar6 * 4),1,__stream);
        if (sVar1 != 1) goto LAB_001f102c;
        for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
          if (*(ushort *)(buf + uVar2 * 4 + 2) < 0x100) {
            bVar5 = true;
          }
          else {
            bVar7 = true;
          }
        }
        uVar4 = uVar4 - (int)uVar6;
      } while (!bVar7 || !bVar5);
      bVar5 = true;
      bVar7 = bVar5;
LAB_001f1002:
      cVar3 = CHARMAP_TYPE_MB;
      if (!bVar7) {
        cVar3 = (uint)bVar7;
      }
      if (!bVar5) {
        cVar3 = (uint)bVar7;
      }
      *map_type = cVar3;
      fseek(__stream,__off,0);
      return (osfildef *)__stream;
    }
LAB_001f102c:
    fclose(__stream);
  }
  return (osfildef *)0x0;
}

Assistant:

osfildef *CCharmap::open_map_file(class CResLoader *res_loader,
                                  const char *table_name,
                                  charmap_type_t *map_type)
{
    osfildef *fp;
    char respath[100];
    ulong startpos;
    uchar buf[256];
    uint entry_cnt;
    int found_single;
    int found_double;

    /*
     *   Generate the full resource path - character mapping resource paths
     *   always start with "charmap/" followed by the table name, plus the
     *   ".tcm" extension.  We use lower-case names for the mapping files, so
     *   explicitly convert to lower, in case we're on a case-sensitive file
     *   system like Unix.  
     */
    t3sprintf(respath, sizeof(respath), "charmap/%s.tcm", table_name);
    t3strlwr(respath);

    /* open the file for the character set */
    fp = res_loader->open_res_file(respath, "charmap/cmaplib", "CLIB");

    /* if we couldn't open the mapping file, return failure */
    if (fp == 0)
        return 0;

    /* note the initial seek position */
    startpos = osfpos(fp);

    /* read the header and the local-to-unicode header */
    if (osfrb(fp, buf, 6))
        goto fail;

    /* get the number of entries from the local-to-unicode header */
    entry_cnt = osrp2(buf + 4);

    /* 
     *   Scan the entries to determine if we have single-byte,
     *   double-byte, or both.  
     */
    found_single = found_double = FALSE;
    while (entry_cnt > 0)
    {
        size_t cur;
        const uchar *p;

        /* read up to a buffer-full or the remaining size */
        cur = sizeof(buf)/4;
        if (cur > entry_cnt)
            cur = entry_cnt;

        /* read it */
        if (osfrb(fp, buf, cur*4))
            goto fail;

        /* deduct the amount we just read from the amount remaining */
        entry_cnt -= cur;

        /* scan the entries */
        for (p = buf ; cur > 0 ; --cur, p += 4)
        {
            /* 
             *   Note whether this is a single-byte or double-byte entry.
             *   If the high-order byte is non-zero, it's a double-byte
             *   entry; otherwise, it's a single-byte entry.
             *   
             *   Note that we read the UINT2 at (p+2), because that's the
             *   local character-set code point in this tuple.  
             */
            if (((uint)osrp2(p + 2)) > 0xFF)
                found_double = TRUE;
            else
                found_single = TRUE;
        }

        /* 
         *   if we've found both single- and double-byte characters so
         *   far, there's no need to look any further, since we know
         *   everything about the file now 
         */
        if (found_single && found_double)
            break;
    }

    /* 
     *   create the appropriate mapper, depending on whether we found
     *   single, double, or mixed characters 
     */
    if (found_single && found_double)
    {
        /* it's mixed */
        *map_type = CHARMAP_TYPE_MB;
    }
    else if (found_double)
    {
        /* it's all double-byte */
        *map_type = CHARMAP_TYPE_DB;
    }
    else if (found_single)
    {
        /* it's all single-byte */
        *map_type = CHARMAP_TYPE_SB;
    }
    else
    {
        /* no mappings found at all - presume it's a single-byte mapper */
        *map_type = CHARMAP_TYPE_SB;
    }

    /* seek back to the start of the table */
    osfseek(fp, startpos, OSFSK_SET);

    /* return the file pointer */
    return fp;

fail:
    /* close the file and return failure */
    osfcls(fp);
    return 0;
}